

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_timer.h
# Opt level: O0

int64_t aom_usec_timer_elapsed(aom_usec_timer *t)

{
  timeval diff;
  aom_usec_timer *t_local;
  
  diff.tv_sec = (t->end).tv_sec - (t->begin).tv_sec;
  diff.tv_usec = (t->end).tv_usec - (t->begin).tv_usec;
  if (diff.tv_usec < 0) {
    diff.tv_sec = diff.tv_sec + -1;
    diff.tv_usec = diff.tv_usec + 1000000;
  }
  return diff.tv_sec * 1000000 + diff.tv_usec;
}

Assistant:

static inline int64_t aom_usec_timer_elapsed(struct aom_usec_timer *t) {
#if defined(_WIN32)
  LARGE_INTEGER freq, diff;

  diff.QuadPart = t->end.QuadPart - t->begin.QuadPart;

  QueryPerformanceFrequency(&freq);
  return diff.QuadPart * 1000000 / freq.QuadPart;
#else
  struct timeval diff;

  timersub(&t->end, &t->begin, &diff);
  return ((int64_t)diff.tv_sec) * 1000000 + diff.tv_usec;
#endif
}